

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::PortalImageInfiniteLight::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PortalImageInfiniteLight *this)

{
  Frame *in_stack_ffffffffffffffc0;
  string local_38;
  
  LightBase::BaseToString_abi_cxx11_(&local_38,&this->super_LightBase);
  StringPrintf<std::__cxx11::string,std::__cxx11::string_const&,float_const&,pstd::array<pbrt::Point3<float>,4>const&,pbrt::Frame_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ PortalImageInfiniteLight %s filename:%s scale: %f portal: %s  portalFrame: %s ]",
             (char *)&local_38,&this->filename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->scale,
             (float *)&this->portal,(array<pbrt::Point3<float>,_4> *)&this->portalFrame,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string PortalImageInfiniteLight::ToString() const {
    return StringPrintf("[ PortalImageInfiniteLight %s filename:%s scale: %f portal: %s "
                        " portalFrame: %s ]",
                        BaseToString(), filename, scale, portal, portalFrame);
}